

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O3

Promise<void> __thiscall
capnp::_::anon_unknown_0::TestHangingTailCallee::foo(TestHangingTailCallee *this,FooContext context)

{
  PromiseArena *pPVar1;
  PromiseArena *pPVar2;
  OwnPromiseNode node;
  void *pvVar3;
  AttachmentPromiseNodeBase *this_00;
  OwnPromiseNode local_38;
  PromiseArenaMember *local_30;
  
  *(int *)context.hook[1]._vptr_CallContextHook = *(int *)context.hook[1]._vptr_CallContextHook + 1;
  kj::_::neverDone();
  local_38.ptr = (PromiseNode *)local_30;
  pPVar1 = (PromiseArena *)context.hook[2]._vptr_CallContextHook;
  pPVar2 = local_30->arena;
  if (pPVar2 == (PromiseArena *)0x0 || (ulong)((long)local_30 - (long)pPVar2) < 0x28) {
    pvVar3 = operator_new(0x400);
    this_00 = (AttachmentPromiseNodeBase *)((long)pvVar3 + 0x3d8);
    kj::_::AttachmentPromiseNodeBase::AttachmentPromiseNodeBase(this_00,&local_38);
    *(undefined ***)((long)pvVar3 + 0x3d8) = &PTR_destroy_006ba4c0;
    *(undefined1 *)((long)pvVar3 + 0x3f0) = 1;
    *(PromiseArena **)((long)pvVar3 + 0x3f8) = pPVar1;
    *(void **)((long)pvVar3 + 0x3e0) = pvVar3;
  }
  else {
    local_30->arena = (PromiseArena *)0x0;
    this_00 = (AttachmentPromiseNodeBase *)&local_30[-3].arena;
    kj::_::AttachmentPromiseNodeBase::AttachmentPromiseNodeBase(this_00,&local_38);
    local_30[-3].arena = (PromiseArena *)&PTR_destroy_006ba4c0;
    *(undefined1 *)&local_30[-1]._vptr_PromiseArenaMember = 1;
    local_30[-1].arena = pPVar1;
    local_30[-2]._vptr_PromiseArenaMember = (_func_int **)pPVar2;
  }
  node.ptr = local_38.ptr;
  (this->super_Server)._vptr_Server = (_func_int **)this_00;
  if (&(local_38.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
    local_38.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(node.ptr)->super_PromiseArenaMember);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> foo(FooContext context) override {
    ++callCount;
    return kj::Promise<void>(kj::NEVER_DONE)
        .attach(kj::defer([&cancelCount = cancelCount]() { ++cancelCount; }));
  }